

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O1

string * pbrt::internal::ToString3<double>(double x,double y,double z)

{
  string *in_RDI;
  double local_30;
  double local_28;
  double local_20;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<double&,double&,double&>
            (in_RDI,"[ %f, %f, %f ]",&local_20,&local_28,&local_30);
  return in_RDI;
}

Assistant:

std::string internal::ToString3(T x, T y, T z) {
    if (std::is_floating_point<T>::value)
        return StringPrintf("[ %f, %f, %f ]", x, y, z);
    else
        return StringPrintf("[ %d, %d, %d ]", x, y, z);
}